

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

iterator * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::begin
          (iterator *__return_storage_ptr__,IntervalMap<unsigned_long,_std::monostate,_0U> *this)

{
  (__return_storage_ptr__->super_const_iterator).map = this;
  (__return_storage_ptr__->super_const_iterator).path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)(__return_storage_ptr__->super_const_iterator).path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement;
  (__return_storage_ptr__->super_const_iterator).path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  (__return_storage_ptr__->super_const_iterator).path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  const_iterator::setToBegin(&__return_storage_ptr__->super_const_iterator);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() {
        iterator it(*this);
        it.setToBegin();
        return it;
    }